

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O1

BOOL Silent_ExtractFormatA
               (LPCSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,LPINT Precision,LPINT Prefix,
               LPINT Type)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  BOOL BVar7;
  uint uVar8;
  char *pcVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  pcVar6 = *Fmt;
  if (pcVar6 == (char *)0x0) {
    return 0;
  }
  if (*pcVar6 != '%') {
    return 0;
  }
  *Fmt = pcVar6 + 1;
  *Out = *pcVar6;
  sVar5 = strlen(*Fmt);
  pcVar6 = (char *)PAL_malloc(sVar5 + 1);
  if (pcVar6 == (char *)0x0) {
    return 0;
  }
  do {
    pbVar11 = (byte *)Out + 1;
    pbVar10 = (byte *)*Fmt;
    bVar1 = *pbVar10;
    uVar2 = *Flags;
    if (bVar1 < 0x2b) {
      if (bVar1 == 0x20) {
        uVar8 = 8;
      }
      else {
        if (bVar1 != 0x23) break;
        uVar8 = 2;
      }
    }
    else if (bVar1 == 0x30) {
      uVar8 = 4;
    }
    else {
      uVar8 = 1;
      if (bVar1 != 0x2d) {
        if (bVar1 != 0x2b) break;
        uVar8 = 0x10;
      }
    }
    *Flags = uVar2 | uVar8;
    *Fmt = (LPCSTR)(pbVar10 + 1);
    *pbVar11 = *pbVar10;
    Out = (LPSTR)pbVar11;
  } while( true );
  if ((~uVar2 & 5) == 0) {
    *Flags = uVar2 - 4;
  }
  iVar4 = isdigit((uint)*pbVar10);
  pbVar10 = (byte *)*Fmt;
  if (iVar4 == 0) {
    if (*pbVar10 == 0x2a) {
      *Width = -2;
      *Fmt = (LPCSTR)(pbVar10 + 1);
      *pbVar11 = *pbVar10;
      pbVar11 = (byte *)Out + 2;
      iVar4 = isdigit((uint)(byte)**Fmt);
      if (iVar4 != 0) {
        *Width = -3;
        while (iVar4 = isdigit((uint)(byte)**Fmt), iVar4 != 0) {
          pbVar10 = (byte *)*Fmt;
          *Fmt = (LPCSTR)(pbVar10 + 1);
          *pbVar11 = *pbVar10;
          pbVar11 = pbVar11 + 1;
        }
      }
    }
  }
  else {
    iVar4 = isdigit((uint)*pbVar10);
    pcVar9 = pcVar6;
    while (iVar4 != 0) {
      *pcVar9 = **Fmt;
      pcVar9 = pcVar9 + 1;
      pbVar10 = (byte *)*Fmt;
      *Fmt = (LPCSTR)(pbVar10 + 1);
      *pbVar11 = *pbVar10;
      pbVar11 = pbVar11 + 1;
      iVar4 = isdigit((uint)(byte)**Fmt);
    }
    *pcVar9 = '\0';
    iVar4 = atoi(pcVar6);
    *Width = iVar4;
    if (iVar4 < 0) goto LAB_001466fd;
  }
  pbVar3 = (byte *)*Fmt;
  pbVar10 = pbVar11;
  if (*pbVar3 == 0x2e) {
    *Fmt = (LPCSTR)(pbVar3 + 1);
    pbVar10 = pbVar11 + 1;
    *pbVar11 = *pbVar3;
    iVar4 = isdigit((uint)(byte)**Fmt);
    pbVar3 = (byte *)*Fmt;
    if (iVar4 == 0) {
      if (*pbVar3 == 0x2a) {
        *Precision = -2;
        *Fmt = (LPCSTR)(pbVar3 + 1);
        pbVar11[1] = *pbVar3;
        pbVar10 = pbVar11 + 2;
        iVar4 = isdigit((uint)(byte)**Fmt);
        if (iVar4 != 0) {
          *Precision = -4;
          while (iVar4 = isdigit((uint)(byte)**Fmt), iVar4 != 0) {
            pbVar11 = (byte *)*Fmt;
            *Fmt = (LPCSTR)(pbVar11 + 1);
            *pbVar10 = *pbVar11;
            pbVar10 = pbVar10 + 1;
          }
        }
      }
      else {
        *Precision = -3;
      }
    }
    else {
      iVar4 = isdigit((uint)*pbVar3);
      pcVar9 = pcVar6;
      while (iVar4 != 0) {
        *pcVar9 = **Fmt;
        pcVar9 = pcVar9 + 1;
        pbVar11 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar11 + 1);
        *pbVar10 = *pbVar11;
        pbVar10 = pbVar10 + 1;
        iVar4 = isdigit((uint)(byte)**Fmt);
      }
      *pcVar9 = '\0';
      iVar4 = atoi(pcVar6);
      *Precision = iVar4;
      if (iVar4 < 0) {
LAB_001466fd:
        SetLastError(0x54f);
        return 0;
      }
    }
  }
  pbVar11 = (byte *)*Fmt;
  if (*pbVar11 == 0x70) {
    *Prefix = 3;
  }
  bVar1 = *pbVar11;
  if (bVar1 < 0x68) {
    if (bVar1 == 0x49) {
      if ((pbVar11[1] == 0x36) && (pbVar11[2] == 0x34)) {
        *Fmt = (LPCSTR)(pbVar11 + 3);
        *Prefix = 3;
      }
    }
    else if (bVar1 == 0x4c) goto LAB_001467a1;
  }
  else if (bVar1 == 0x68) {
    *Prefix = 1;
LAB_001467a1:
    *Fmt = (LPCSTR)(pbVar11 + 1);
  }
  else if (((bVar1 == 0x6c) || (bVar1 == 0x77)) &&
          (*Fmt = (LPCSTR)(pbVar11 + 1), (pbVar11[1] | 0x10) == 0x73)) {
    *Prefix = 2;
  }
  pbVar11 = (byte *)*Fmt;
  bVar1 = *pbVar11;
  BVar7 = 0;
  if (bVar1 < 0x53) {
    if (bVar1 != 0x43) {
      if ((bVar1 != 0x45) && (BVar7 = 0, bVar1 != 0x47)) goto switchD_001467ce_caseD_68;
      goto switchD_001467ce_caseD_65;
    }
switchD_001467ce_caseD_63:
    *Type = 1;
    if ((*Prefix != 1) && (*pbVar11 == 0x43)) {
      *Prefix = 2;
    }
    if (*Prefix == 2) {
      *pbVar10 = 0x6c;
      pbVar10 = pbVar10 + 1;
    }
    *pbVar10 = 99;
LAB_00146888:
    pbVar10 = pbVar10 + 1;
    *Fmt = *Fmt + 1;
    goto LAB_001468b5;
  }
  switch(bVar1) {
  case 99:
    goto switchD_001467ce_caseD_63;
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    goto switchD_001467ce_caseD_64;
  case 0x65:
  case 0x66:
  case 0x67:
switchD_001467ce_caseD_65:
    *Type = 7;
    goto LAB_001468a6;
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto switchD_001467ce_caseD_68;
  case 0x6e:
    if (*Prefix == 1) {
      *pbVar10 = 0x68;
      pbVar10 = pbVar10 + 1;
    }
    pbVar11 = (byte *)*Fmt;
    *Fmt = (LPCSTR)(pbVar11 + 1);
    *pbVar10 = *pbVar11;
    pbVar10 = pbVar10 + 1;
    *Type = 6;
    goto LAB_001468b5;
  case 0x70:
    *Type = 5;
    *Fmt = (LPCSTR)(pbVar11 + 1);
    *pbVar10 = *pbVar11;
    pbVar10 = pbVar10 + 1;
    BVar7 = 1;
    if (*Prefix == 3) {
      if (*Precision == -1) {
        *Precision = 0x10;
      }
    }
    else if (*Precision == -1) {
      *Precision = 8;
    }
    goto switchD_001467ce_caseD_68;
  case 0x73:
switchD_001467ce_caseD_73:
    *Type = 2;
    if ((*Prefix != 1) && (*pbVar11 == 0x53)) {
      *Prefix = 2;
    }
    if (*Prefix == 2) {
      *pbVar10 = 0x6c;
      pbVar10 = pbVar10 + 1;
    }
    *pbVar10 = 0x73;
    goto LAB_00146888;
  }
  if (bVar1 == 0x53) goto switchD_001467ce_caseD_73;
  if (bVar1 != 0x58) goto switchD_001467ce_caseD_68;
switchD_001467ce_caseD_64:
  *Type = 4;
  iVar4 = *Prefix;
  if (iVar4 == 3) {
    pbVar10[0] = 0x6c;
    pbVar10[1] = 0x6c;
    pbVar10 = pbVar10 + 2;
  }
  else {
    if (iVar4 == 2) {
      *pbVar10 = 0x6c;
    }
    else {
      if (iVar4 != 1) goto LAB_001468a3;
      *pbVar10 = 0x68;
    }
    pbVar10 = pbVar10 + 1;
  }
LAB_001468a3:
  pbVar11 = (byte *)*Fmt;
LAB_001468a6:
  *Fmt = (LPCSTR)(pbVar11 + 1);
  *pbVar10 = *pbVar11;
  pbVar10 = pbVar10 + 1;
LAB_001468b5:
  BVar7 = 1;
switchD_001467ce_caseD_68:
  *pbVar10 = 0;
  PAL_free(pcVar6);
  return BVar7;
}

Assistant:

BOOL Silent_ExtractFormatA(LPCSTR *Fmt, LPSTR Out, LPINT Flags, LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) PAL_malloc(strlen(*Fmt)+1);
    if (!TempStr)
    {
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
        case '-':
            *Flags |= PFF_MINUS; break;
        case '+':
            *Flags |= PFF_PLUS; break;
        case '0':
            *Flags |= PFF_ZERO; break;
        case ' ':
            *Flags |= PFF_SPACE; break;
        case '#':
            *Flags |= PFF_POUND; break;
        }
            *Out++ = *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit((unsigned char) **Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit((unsigned char) **Fmt))
        {
            *TempStrPtr++ = **Fmt;
            *Out++ = *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit((unsigned char) **Fmt))
            {
               *Out++ = *(*Fmt)++;
            }
        }
    }


    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit((unsigned char) **Fmt))
            {
                *TempStrPtr++ = **Fmt;
                *Out++ = *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = *(*Fmt)++;
            if (isdigit((unsigned char) **Fmt))
            {
                /* this is an invalid precision because we have a .* then a
                   number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit((unsigned char) **Fmt))
                {
                    *Out++ = *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    /* grab prefix of 'I64' for __int64 */
    if ((*Fmt)[0] == 'I' && (*Fmt)[1] == '6' && (*Fmt)[2] == '4')
    {
        /* convert to 'll' so BSD's snprintf can handle it */
        *Fmt += 3;
        *Prefix = PFF_PREFIX_LONGLONG;
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    /* grab prefix of 'l' or the undocumented 'w' (at least in MSDN) */
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
#ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'c' || **Fmt == 's')
#endif       
        {
            *Prefix = PFF_PREFIX_LONG;
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }

    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'C')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S')
    {
        *Type = PFF_TYPE_STRING;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'S')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        *Out++ = *(*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
            }
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
            }
        }
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    PAL_free(TempStr);
    return Result;
}